

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

void luaG_errormsg(lua_State *L)

{
  ushort uVar1;
  long lVar2;
  StkId pTVar3;
  StkId pTVar4;
  GCObject *pGVar5;
  
  lVar2 = L->errfunc;
  if (lVar2 != 0) {
    pTVar3 = L->top;
    pTVar4 = L->stack;
    pGVar5 = pTVar3[-1].value_.gc;
    (pTVar3->value_).gc = pGVar5;
    uVar1 = pTVar3[-1].tt_;
    pTVar3->tt_ = uVar1;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)pGVar5->tt ||
        ((pGVar5->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x2af,"void luaG_errormsg(lua_State *)");
    }
    pTVar3 = L->top;
    pGVar5 = *(GCObject **)((long)&pTVar4->value_ + lVar2);
    pTVar3[-1].value_.gc = pGVar5;
    uVar1 = *(ushort *)((long)&pTVar4->tt_ + lVar2);
    pTVar3[-1].tt_ = uVar1;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)pGVar5->tt ||
        ((pGVar5->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x2b0,"void luaG_errormsg(lua_State *)");
    }
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    luaD_callnoyield(L,pTVar3 + -1,1);
  }
  luaD_throw(L,2);
}

Assistant:

l_noret luaG_errormsg (lua_State *L) {
  if (L->errfunc != 0) {  /* is there an error handling function? */
    StkId errfunc = restorestack(L, L->errfunc);
    setobjs2s(L, L->top, L->top - 1);  /* move argument */
    setobjs2s(L, L->top - 1, errfunc);  /* push function */
    L->top++;  /* assume EXTRA_STACK */
    luaD_callnoyield(L, L->top - 2, 1);  /* call it */
  }
  luaD_throw(L, LUA_ERRRUN);
}